

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

Abc_Ntk_t *
Abc_FlowRetime_MinReg
          (Abc_Ntk_t *pNtk,int fVerbose,int fComputeInitState,int fGuaranteeInitState,
          int fBlockConst,int fForwardOnly,int fBackwardOnly,int nMaxIters,int maxDelay,
          int fFastButConservative)

{
  Abc_NtkType_t AVar1;
  Abc_Ntk_t *pAVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  MinRegMan_t *pMVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Obj_t *pAVar8;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar9;
  Abc_Obj_t *pAVar10;
  void **ppvVar11;
  Vec_Int_t *pVVar12;
  Flow_Data_t *pFVar13;
  Abc_Ntk_t *pNtk_00;
  void *pvVar14;
  Abc_Obj_t *pAVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  long lVar20;
  
  pMVar6 = (MinRegMan_t *)malloc(0xb0);
  pManMR = pMVar6;
  pMVar6->pNtk = pNtk;
  pMVar6->fVerbose = fVerbose;
  pMVar6->fGuaranteeInitState = fGuaranteeInitState;
  pMVar6->fBlockConst = fBlockConst;
  pMVar6->fForwardOnly = fForwardOnly;
  pMVar6->fBackwardOnly = fBackwardOnly;
  pMVar6->nMaxIters = nMaxIters;
  pMVar6->maxDelay = maxDelay;
  pMVar6->fComputeInitState = fComputeInitState;
  pMVar6->fConservTimingOnly = fFastButConservative;
  pVVar7 = Vec_PtrAlloc(100);
  pManMR->vNodes = pVVar7;
  pVVar7 = Vec_PtrAlloc(2);
  pMVar6 = pManMR;
  pManMR->vInitConstraints = pVVar7;
  pMVar6->pInitNtk = (Abc_Ntk_t *)0x0;
  pMVar6->pInitToOrig = (NodeLag_t *)0x0;
  pMVar6->sizeInitToOrig = 0;
  if (pMVar6->fVerbose != 0) {
    puts("Flow-based minimum-register retiming...");
  }
  if (pNtk->nObjCounts[8] != pNtk->vBoxes->nSize) {
    puts("\tERROR: Can not retime with black/white boxes");
    return pNtk;
  }
  if (maxDelay != 0) {
    if (pManMR->fVerbose != 0) {
      printf("\tmax delay constraint = %d\n");
    }
    uVar3 = Abc_NtkLevel(pNtk);
    if (maxDelay < (int)uVar3) {
      printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n",
             (ulong)(uint)maxDelay,(ulong)uVar3);
      return pNtk;
    }
  }
  if (pManMR->fVerbose != 0) {
    printf("\tnetlist type = ");
  }
  AVar1 = pNtk->ntkType;
  iVar19 = pManMR->fVerbose;
  if (AVar1 == ABC_NTK_STRASH) {
    if (iVar19 != 0) {
      pcVar18 = "strash/";
      goto LAB_003d6e3c;
    }
  }
  else if (AVar1 == ABC_NTK_LOGIC) {
    if (iVar19 != 0) {
      pcVar18 = "logic/";
      goto LAB_003d6e3c;
    }
  }
  else if (AVar1 == ABC_NTK_NETLIST) {
    if (iVar19 != 0) {
      pcVar18 = "netlist/";
LAB_003d6e3c:
      printf(pcVar18);
    }
  }
  else if (iVar19 != 0) {
    pcVar18 = "***unknown***/";
    goto LAB_003d6e3c;
  }
  iVar19 = pManMR->fVerbose;
  switch(pNtk->ntkFunc) {
  case ABC_FUNC_SOP:
    if (iVar19 != 0) {
      pcVar18 = "sop";
LAB_003d6ea6:
      puts(pcVar18);
    }
    break;
  case ABC_FUNC_BDD:
    if (iVar19 != 0) {
      pcVar18 = "bdd";
      goto LAB_003d6ea6;
    }
    break;
  case ABC_FUNC_AIG:
    if (iVar19 != 0) {
      pcVar18 = "aig";
      goto LAB_003d6ea6;
    }
    break;
  case ABC_FUNC_MAP:
    if (iVar19 != 0) {
      pcVar18 = "mapped";
      goto LAB_003d6ea6;
    }
    break;
  default:
    if (iVar19 != 0) {
      pcVar18 = "***unknown***";
      goto LAB_003d6ea6;
    }
  }
  if ((pManMR->fVerbose != 0) && (printf("\tinitial reg count = %d\n"), pManMR->fVerbose != 0)) {
    Abc_NtkLevel(pNtk);
    printf("\tinitial levels = %d\n");
    if ((pManMR->fVerbose != 0) && (Abc_FlowRetime_PrintInitStateInfo(pNtk), pManMR->fVerbose != 0))
    {
      puts("\tpushing bubbles out of latch boxes");
    }
  }
  for (iVar19 = 0; iVar19 < pNtk->vBoxes->nSize; iVar19 = iVar19 + 1) {
    pAVar8 = Abc_NtkBox(pNtk,iVar19);
    uVar3 = *(uint *)&pAVar8->field_0x14;
    if ((uVar3 & 0xf) == 8) {
      ppvVar11 = pAVar8->pNtk->vObjs->pArray;
      pAVar15 = (Abc_Obj_t *)ppvVar11[*(pAVar8->vFanins).pArray];
      if (((ulong)pAVar15 & 1) != 0) {
        __assert_fail("!Abc_ObjIsComplement(pBi)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x17b,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
      }
      pvVar14 = ppvVar11[*(pAVar8->vFanouts).pArray];
      if (((ulong)pvVar14 & 1) != 0) {
        __assert_fail("!Abc_ObjIsComplement(pBo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x17c,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
      }
      pAVar2 = pManMR->pNtk;
      uVar16 = 0;
      if (((*(byte *)((long)pvVar14 + 0x15) & 4) != 0) &&
         (uVar16 = 0, 0 < *(int *)((long)pvVar14 + 0x2c))) {
        iVar4 = Abc_LatchIsInit0(pAVar8);
        if (iVar4 == 0) {
          iVar4 = Abc_LatchIsInit1(pAVar8);
          uVar3 = *(uint *)&pAVar8->field_0x14;
          if (iVar4 != 0) {
            aVar9 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
            if ((uVar3 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                            ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            goto LAB_003d6fe5;
          }
        }
        else {
          uVar3 = *(uint *)&pAVar8->field_0x14;
          aVar9 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
          if ((uVar3 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                          ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
          }
LAB_003d6fe5:
          pAVar8->field_5 = aVar9;
        }
        uVar16 = 0x400;
      }
      uVar16 = uVar3 & 0x400 ^ uVar16;
      uVar17 = *(uint *)&pAVar15->field_0x14 & 0x400;
      uVar3 = *(uint *)&pAVar15->field_0x14 & 0xfffffbff;
      *(uint *)&pAVar15->field_0x14 = uVar17 ^ uVar16 | uVar3;
      if ((pAVar2->ntkType != ABC_NTK_STRASH) && (uVar17 != uVar16)) {
        *(uint *)&pAVar15->field_0x14 = uVar3;
        pAVar10 = Abc_NtkCreateNodeInv
                            (pAVar2,(Abc_Obj_t *)
                                    pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray]);
        Abc_ObjPatchFanin(pAVar15,(Abc_Obj_t *)
                                  pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray],pAVar10);
      }
      *(byte *)((long)pvVar14 + 0x15U) = *(byte *)((long)pvVar14 + 0x15U) & 0xfb;
      pAVar8->field_0x15 = pAVar8->field_0x15 & 0xfb;
    }
  }
  if (pManMR->fVerbose != 0) {
    Abc_FlowRetime_PrintInitStateInfo(pNtk);
  }
  for (iVar19 = 0; pMVar6 = pManMR, iVar19 < pNtk->vBoxes->nSize; iVar19 = iVar19 + 1) {
    pAVar8 = Abc_NtkBox(pNtk,iVar19);
    if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 8) {
      if ((pAVar8->vFanins).nSize != 1) {
        __assert_fail("Abc_ObjFaninNum(pObj) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x8c,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      if ((pAVar8->vFanouts).nSize != 1) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x8d,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      if ((*(uint *)&pAVar8->field_0x14 >> 10 & 1) != 0) {
        __assert_fail("!Abc_ObjFaninC0(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x8e,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      ppvVar11 = pAVar8->pNtk->vObjs->pArray;
      pAVar15 = (Abc_Obj_t *)ppvVar11[*(pAVar8->vFanins).pArray];
      if ((*(uint *)&pAVar15->field_0x14 & 0xf) != 4) {
        __assert_fail("Abc_ObjIsBi(pNext)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x91,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      iVar4 = (pAVar15->vFanins).nSize;
      if (1 < iVar4) {
        __assert_fail("Abc_ObjFaninNum(pNext) <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x92,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      if (iVar4 == 0) {
        pAVar2 = pAVar15->pNtk;
        if (pAVar2->ntkType == ABC_NTK_STRASH) {
          pAVar10 = Abc_AigConst1(pAVar2);
        }
        else {
          pAVar10 = Abc_NtkCreateNodeConst0(pAVar2);
        }
        Abc_ObjAddFanin(pAVar15,pAVar10);
        ppvVar11 = pAVar8->pNtk->vObjs->pArray;
      }
      uVar3 = *(uint *)((long)ppvVar11[*(pAVar8->vFanouts).pArray] + 0x14);
      if ((uVar3 & 0xf) != 5) {
        __assert_fail("Abc_ObjIsBo(pNext)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x97,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      if (*(int *)((long)ppvVar11[*(pAVar8->vFanouts).pArray] + 0x1c) != 1) {
        __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x98,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      if ((uVar3 >> 10 & 1) != 0) {
        __assert_fail("!Abc_ObjFaninC0(pNext)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x99,
                      "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
    }
  }
  pManMR->nLatches = pNtk->nObjCounts[8];
  iVar19 = pNtk->vObjs->nSize;
  pMVar6->nNodes = iVar19 + 1;
  pVVar12 = Vec_IntStart(iVar19 * 2 + 0xc);
  pMVar6 = pManMR;
  pManMR->vSinkDistHist = pVVar12;
  if (maxDelay != 0) {
    Abc_FlowRetime_InitTiming(pNtk);
    pMVar6 = pManMR;
  }
  pVVar12 = Vec_IntStart(pMVar6->nNodes);
  pMVar6 = pManMR;
  pManMR->vLags = pVVar12;
  memset(pVVar12->pArray,0,(long)pMVar6->nNodes << 2);
  pMVar6 = pManMR;
  pFVar13 = (Flow_Data_t *)malloc((long)pManMR->nNodes * 0x18);
  pMVar6->pDataArray = pFVar13;
  Abc_FlowRetime_ClearFlows(1);
  pMVar6 = pManMR;
  pAVar2 = pManMR->pNtk;
  pManMR->fIsForward = 1;
  pMVar6->iteration = 0;
  if (pMVar6->fBackwardOnly == 0) {
    iVar19 = 0;
    do {
      if (iVar19 == pMVar6->nMaxIters) break;
      pMVar6->subIteration = 0;
      if (pMVar6->fVerbose != 0) {
        printf("\tforward iteration %d\n");
      }
      iVar4 = pAVar2->nObjCounts[8];
      Abc_FlowRetime_MarkBlocks(pAVar2);
      if (pManMR->maxDelay == 0) {
        Abc_FlowRetime_PushFlows(pAVar2,1);
      }
      else {
        Abc_FlowRetime_ConstrainConserv(pAVar2);
        while (iVar19 = Abc_FlowRetime_RefineConstraints(), iVar19 != 0) {
          pManMR->subIteration = pManMR->subIteration + 1;
          Abc_FlowRetime_ClearFlows(0);
        }
      }
      iVar5 = Abc_FlowRetime_ImplementCut(pAVar2);
      Abc_FlowRetime_ClearFlows(1);
      pMVar6 = pManMR;
      iVar19 = pManMR->iteration + 1;
      pManMR->iteration = iVar19;
    } while (iVar5 != iVar4);
  }
  pNtk_00 = pAVar2;
  if (pAVar2->ntkType == ABC_NTK_STRASH) {
    Abc_NtkReassignIds(pAVar2);
    pNtk_00 = Abc_FlowRetime_NtkSilentRestrash(pAVar2,1);
    pMVar6 = pManMR;
    pManMR->pNtk = pNtk_00;
  }
  if ((pMVar6->fComputeInitState != 0) && (pMVar6->fVerbose != 0)) {
    Abc_FlowRetime_PrintInitStateInfo(pNtk_00);
    pMVar6 = pManMR;
  }
  pMVar6->fIsForward = 0;
  if (pMVar6->fForwardOnly == 0) {
    do {
      pMVar6->iteration = 0;
      if (pMVar6->fGuaranteeInitState != 0) {
        if (pNtk_00 != pAVar2) {
          Abc_NtkDelete(pNtk_00);
        }
        pNtk_00 = Abc_NtkAlloc(pAVar2->ntkType,pAVar2->ntkFunc,1);
        pcVar18 = Extra_UtilStrsav(pAVar2->pName);
        pNtk_00->pName = pcVar18;
        pcVar18 = Extra_UtilStrsav(pAVar2->pSpec);
        pNtk_00->pSpec = pcVar18;
        for (iVar19 = 0; iVar4 = pAVar2->vObjs->nSize, iVar19 < iVar4; iVar19 = iVar19 + 1) {
          pAVar8 = Abc_NtkObj(pAVar2,iVar19);
          if (pAVar8 != (Abc_Obj_t *)0x0) {
            if ((pAVar2->ntkType == ABC_NTK_STRASH) &&
               (iVar4 = Abc_AigNodeIsConst(pAVar8), iVar4 != 0)) {
              pAVar15 = Abc_AigConst1(pNtk_00);
            }
            else {
              pAVar15 = Abc_NtkDupObj(pNtk_00,pAVar8,0);
            }
            pManMR->pDataArray[(uint)pAVar8->Id].field_1.pred = pAVar15;
            *(undefined2 *)(pManMR->pDataArray + (uint)pAVar8->Id) = 0;
            uVar16 = *(uint *)&pAVar8->field_0x14 & 0x400;
            uVar3 = *(uint *)&pAVar15->field_0x14;
            *(uint *)&pAVar15->field_0x14 = uVar3 & 0xfffffbff | uVar16;
            uVar17 = *(uint *)&pAVar8->field_0x14 & 0x800;
            *(uint *)&pAVar15->field_0x14 = uVar3 & 0xfffff3ff | uVar16 | uVar17;
            *(uint *)&pAVar15->field_0x14 =
                 uVar3 & 0xfffff37f | uVar16 | uVar17 | *(uint *)&pAVar8->field_0x14 & 0x80;
          }
        }
        for (iVar19 = 0; iVar19 < iVar4; iVar19 = iVar19 + 1) {
          pAVar8 = Abc_NtkObj(pAVar2,iVar19);
          if (pAVar8 != (Abc_Obj_t *)0x0) {
            pAVar15 = pManMR->pDataArray[(uint)pAVar8->Id].field_1.pred;
            if (pAVar15 == (Abc_Obj_t *)0x0) {
              __assert_fail("pObjCopy",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                            ,0x47a,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
            }
            for (lVar20 = 0; lVar20 < (pAVar8->vFanins).nSize; lVar20 = lVar20 + 1) {
              pvVar14 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar20]];
              pAVar10 = pManMR->pDataArray[*(uint *)((long)pvVar14 + 0x10)].field_1.pred;
              if (pAVar10 == (Abc_Obj_t *)0x0) {
                __assert_fail("pNextCopy",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                              ,0x47d,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
              }
              if (((*(uint *)&pAVar10->field_0x14 ^ *(uint *)((long)pvVar14 + 0x14)) & 0xf) != 0) {
                __assert_fail("pNext->Type == pNextCopy->Type",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                              ,0x47e,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
              }
              Abc_ObjAddFanin(pAVar15,pAVar10);
            }
          }
          iVar4 = pAVar2->vObjs->nSize;
        }
        for (iVar19 = 0; pMVar6 = pManMR, iVar19 < iVar4; iVar19 = iVar19 + 1) {
          pAVar8 = Abc_NtkObj(pAVar2,iVar19);
          if (pAVar8 != (Abc_Obj_t *)0x0) {
            pAVar15 = pManMR->pDataArray[(uint)pAVar8->Id].field_1.pred;
            if ((pAVar8->vFanouts).nSize != (pAVar15->vFanouts).nSize) {
              __assert_fail("Abc_ObjFanoutNum( pObj ) == Abc_ObjFanoutNum( pObjCopy )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                            ,0x487,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
            }
            if ((pAVar8->vFanins).nSize != (pAVar15->vFanins).nSize) {
              __assert_fail("Abc_ObjFaninNum( pObj ) == Abc_ObjFaninNum( pObjCopy )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                            ,0x488,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
            }
          }
          iVar4 = pAVar2->vObjs->nSize;
        }
        if (pAVar2->nObjs != pNtk_00->nObjs) {
          __assert_fail("Abc_NtkObjNum( pNtk ) == Abc_NtkObjNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48c,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar2->nObjCounts[8] != pNtk_00->nObjCounts[8]) {
          __assert_fail("Abc_NtkLatchNum( pNtk ) == Abc_NtkLatchNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48d,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar2->vPos->nSize != pNtk_00->vPos->nSize) {
          __assert_fail("Abc_NtkPoNum( pNtk ) == Abc_NtkPoNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48e,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar2->vPis->nSize != pNtk_00->vPis->nSize) {
          __assert_fail("Abc_NtkPiNum( pNtk ) == Abc_NtkPiNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48f,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        pManMR->pNtk = pNtk_00;
        if (pMVar6->fVerbose != 0) {
          printf("\trestoring network. regs = %d\n");
          pMVar6 = pManMR;
        }
      }
      if (pMVar6->fComputeInitState != 0) {
        Abc_FlowRetime_SetupBackwardInit(pNtk_00);
        pMVar6 = pManMR;
      }
      iVar19 = pMVar6->iteration;
      do {
        if (iVar19 == pMVar6->nMaxIters) break;
        pMVar6->subIteration = 0;
        if (pMVar6->fVerbose != 0) {
          printf("\tbackward iteration %d\n");
        }
        iVar4 = pNtk_00->nObjCounts[8];
        Abc_FlowRetime_AddInitBias();
        Abc_FlowRetime_MarkBlocks(pNtk_00);
        if (pManMR->maxDelay == 0) {
          Abc_FlowRetime_PushFlows(pNtk_00,1);
        }
        else {
          Abc_FlowRetime_ConstrainConserv(pNtk_00);
          while (iVar19 = Abc_FlowRetime_RefineConstraints(), iVar19 != 0) {
            pManMR->subIteration = pManMR->subIteration + 1;
            Abc_FlowRetime_ClearFlows(0);
          }
        }
        Abc_FlowRetime_RemoveInitBias();
        iVar5 = Abc_FlowRetime_ImplementCut(pNtk_00);
        Abc_FlowRetime_ClearFlows(1);
        pMVar6 = pManMR;
        iVar19 = pManMR->iteration + 1;
        pManMR->iteration = iVar19;
      } while (iVar5 != iVar4);
      if (pMVar6->fComputeInitState == 0) break;
      iVar19 = Abc_FlowRetime_SolveBackwardInit(pNtk_00);
      if (iVar19 != 0) {
        if (pManMR->fVerbose != 0) {
          Abc_FlowRetime_PrintInitStateInfo(pNtk_00);
        }
        break;
      }
      if (pManMR->fGuaranteeInitState == 0) goto LAB_003d788a;
      Abc_FlowRetime_ConstrainInit();
      Abc_NtkDelete(pManMR->pInitNtk);
      pMVar6 = pManMR;
      pManMR->pInitNtk = (Abc_Ntk_t *)0x0;
    } while( true );
  }
LAB_003d7311:
  if (pManMR->fComputeInitState != 0) {
    Abc_NtkDelete(pManMR->pInitNtk);
  }
  for (iVar19 = 0; iVar19 < pNtk_00->vObjs->nSize; iVar19 = iVar19 + 1) {
    pAVar8 = Abc_NtkObj(pNtk_00,iVar19);
    if (((fComputeInitState == 0) && (pAVar8 != (Abc_Obj_t *)0x0)) &&
       ((*(uint *)&pAVar8->field_0x14 & 0xf) == 8)) {
      Abc_LatchSetInitDc(pAVar8);
    }
  }
  pMVar6 = pManMR;
  if (pManMR->pDataArray != (Flow_Data_t *)0x0) {
    free(pManMR->pDataArray);
    pMVar6 = pManMR;
    pManMR->pDataArray = (Flow_Data_t *)0x0;
  }
  if (pMVar6->pInitToOrig != (NodeLag_t *)0x0) {
    free(pMVar6->pInitToOrig);
    pMVar6 = pManMR;
    pManMR->pInitToOrig = (NodeLag_t *)0x0;
  }
  if (pMVar6->vNodes != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(pMVar6->vNodes);
    pMVar6 = pManMR;
  }
  if (pMVar6->vLags != (Vec_Int_t *)0x0) {
    Vec_IntFree(pMVar6->vLags);
    pMVar6 = pManMR;
  }
  if (pMVar6->vSinkDistHist != (Vec_Int_t *)0x0) {
    Vec_IntFree(pMVar6->vSinkDistHist);
    pMVar6 = pManMR;
  }
  if (pMVar6->maxDelay != 0) {
    Abc_FlowRetime_FreeTiming(pNtk_00);
  }
  while (pVVar7 = pManMR->vInitConstraints, pVVar7->nSize != 0) {
    pvVar14 = Vec_PtrPop(pVVar7);
    free(*(void **)((long)pvVar14 + 0x10));
    free(pvVar14);
  }
  free(pVVar7);
  pMVar6 = pManMR;
  pManMR->vInitConstraints = (Vec_Ptr_t *)0x0;
  if (pNtk_00->ntkType == ABC_NTK_STRASH) {
    Abc_NtkReassignIds(pNtk_00);
    pNtk_00 = Abc_FlowRetime_NtkSilentRestrash(pNtk_00,1);
    pMVar6 = pManMR;
  }
  if ((pMVar6->fVerbose != 0) &&
     (printf("\tfinal reg count = %d\n",(ulong)(uint)pNtk_00->nObjCounts[8]), pManMR->fVerbose != 0)
     ) {
    uVar3 = Abc_NtkLevel(pNtk_00);
    printf("\tfinal levels = %d\n",(ulong)uVar3);
  }
  Abc_NtkDoCheck(pNtk_00);
  if (pManMR != (MinRegMan_t *)0x0) {
    free(pManMR);
    pManMR = (MinRegMan_t *)0x0;
  }
  return pNtk_00;
LAB_003d788a:
  puts("WARNING: no equivalent init state. setting all initial states to don\'t-cares");
  for (iVar19 = 0; iVar19 < pNtk_00->vBoxes->nSize; iVar19 = iVar19 + 1) {
    pAVar8 = Abc_NtkBox(pNtk_00,iVar19);
    if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 8) {
      Abc_LatchSetInitDc(pAVar8);
    }
  }
  goto LAB_003d7311;
}

Assistant:

Abc_Ntk_t *
Abc_FlowRetime_MinReg( Abc_Ntk_t * pNtk, int fVerbose, 
                       int fComputeInitState, int fGuaranteeInitState, int fBlockConst,
                       int fForwardOnly, int fBackwardOnly, int nMaxIters,
                       int maxDelay, int fFastButConservative ) {

  int i;
  Abc_Obj_t   *pObj, *pNext;
  InitConstraint_t *pData;

  // create manager
  pManMR = ABC_ALLOC( MinRegMan_t, 1 );

  pManMR->pNtk = pNtk;
  pManMR->fVerbose = fVerbose;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fGuaranteeInitState = fGuaranteeInitState;
  pManMR->fBlockConst = fBlockConst;
  pManMR->fForwardOnly = fForwardOnly;
  pManMR->fBackwardOnly = fBackwardOnly;
  pManMR->nMaxIters = nMaxIters;
  pManMR->maxDelay = maxDelay;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fConservTimingOnly = fFastButConservative;
  pManMR->vNodes = Vec_PtrAlloc(100);
  pManMR->vInitConstraints = Vec_PtrAlloc(2);
  pManMR->pInitNtk = NULL;
  pManMR->pInitToOrig = NULL;
  pManMR->sizeInitToOrig = 0;

  vprintf("Flow-based minimum-register retiming...\n");  

  if (!Abc_NtkHasOnlyLatchBoxes(pNtk)) {
    printf("\tERROR: Can not retime with black/white boxes\n");
    return pNtk;
  }

  if (maxDelay) {
    vprintf("\tmax delay constraint = %d\n", maxDelay);
    if (maxDelay < (i = Abc_NtkLevel(pNtk))) {
      printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n", maxDelay, i);
      return pNtk;
    }
  }

  // print info about type of network
  vprintf("\tnetlist type = ");
  if (Abc_NtkIsNetlist( pNtk )) { vprintf("netlist/"); }
  else if (Abc_NtkIsLogic( pNtk )) { vprintf("logic/"); }
  else if (Abc_NtkIsStrash( pNtk )) { vprintf("strash/"); }
  else { vprintf("***unknown***/"); }
  if (Abc_NtkHasSop( pNtk )) { vprintf("sop\n"); }
  else if (Abc_NtkHasBdd( pNtk )) { vprintf("bdd\n"); }
  else if (Abc_NtkHasAig( pNtk )) { vprintf("aig\n"); }
  else if (Abc_NtkHasMapping( pNtk )) { vprintf("mapped\n"); }
  else { vprintf("***unknown***\n"); }

  vprintf("\tinitial reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tinitial levels = %d\n", Abc_NtkLevel(pNtk));

  // remove bubbles from latch boxes
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);
  vprintf("\tpushing bubbles out of latch boxes\n");
  Abc_NtkForEachLatch( pNtk, pObj, i )
    Abc_FlowRetime_RemoveLatchBubbles(pObj);
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);

  // check for box inputs/outputs
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    assert(Abc_ObjFaninNum(pObj) == 1);
    assert(Abc_ObjFanoutNum(pObj) == 1);
    assert(!Abc_ObjFaninC0(pObj));

    pNext = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBi(pNext));
    assert(Abc_ObjFaninNum(pNext) <= 1);
    if(Abc_ObjFaninNum(pNext) == 0) // every Bi should have a fanin
      Abc_FlowRetime_AddDummyFanin( pNext );
 
    pNext = Abc_ObjFanout0(pObj);
    assert(Abc_ObjIsBo(pNext));
    assert(Abc_ObjFaninNum(pNext) == 1);
    assert(!Abc_ObjFaninC0(pNext));
  }

  pManMR->nLatches = Abc_NtkLatchNum( pNtk );
  pManMR->nNodes = Abc_NtkObjNumMax( pNtk )+1;
   
  // build histogram
  pManMR->vSinkDistHist = Vec_IntStart( pManMR->nNodes*2+10 );

  // initialize timing
  if (maxDelay)
    Abc_FlowRetime_InitTiming( pNtk );

  // create lag and Flow_Data structure
  pManMR->vLags = Vec_IntStart(pManMR->nNodes);
  memset(pManMR->vLags->pArray, 0, sizeof(int)*pManMR->nNodes);

  pManMR->pDataArray = ABC_ALLOC( Flow_Data_t, pManMR->nNodes );
  Abc_FlowRetime_ClearFlows( 1 );

  // main loop!
  pNtk = Abc_FlowRetime_MainLoop();

  // cleanup node fields
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    // if not computing init state, set all latches to DC
    if (!fComputeInitState && Abc_ObjIsLatch(pObj))
      Abc_LatchSetInitDc(pObj);
  }

  // deallocate space
  ABC_FREE( pManMR->pDataArray );
  if (pManMR->pInitToOrig) ABC_FREE( pManMR->pInitToOrig );
  if (pManMR->vNodes) Vec_PtrFree(pManMR->vNodes);
  if (pManMR->vLags) Vec_IntFree(pManMR->vLags);
  if (pManMR->vSinkDistHist) Vec_IntFree(pManMR->vSinkDistHist);
  if (pManMR->maxDelay) Abc_FlowRetime_FreeTiming( pNtk );
  while( Vec_PtrSize( pManMR->vInitConstraints )) {
    pData = (InitConstraint_t*)Vec_PtrPop( pManMR->vInitConstraints );
    //assert( pData->pBiasNode );
    //Abc_NtkDeleteObj( pData->pBiasNode );
    ABC_FREE( pData->vNodes.pArray );
    ABC_FREE( pData );
  }
  ABC_FREE( pManMR->vInitConstraints );

  // restrash if necessary
  if (Abc_NtkIsStrash(pNtk)) {
    Abc_NtkReassignIds( pNtk );
    pNtk = Abc_FlowRetime_NtkSilentRestrash( pNtk, 1 );
  }
  
  vprintf("\tfinal reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tfinal levels = %d\n", Abc_NtkLevel(pNtk));

#if defined(DEBUG_CHECK)
  Abc_NtkDoCheck( pNtk );
#endif

  // free manager
  ABC_FREE( pManMR );

  return pNtk;
}